

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O1

ENetHost *
enet_host_create(ENetAddress *address,size_t peerCount,size_t channelLimit,
                enet_uint32 incomingBandwidth,enet_uint32 outgoingBandwidth)

{
  ENetSocket socket;
  int iVar1;
  enet_uint32 eVar2;
  uint uVar3;
  _ENetHost *__s;
  ENetPeer **ppEVar4;
  ENetPeer *pEVar5;
  size_t sVar6;
  ulong uVar7;
  
  if ((peerCount < 0x1000000) && (__s = (_ENetHost *)enet_malloc(0x2b50), __s != (_ENetHost *)0x0))
  {
    memset(__s,0,0x2b50);
    ppEVar4 = (ENetPeer **)enet_malloc(0x7fffff8);
    __s->peer_list = ppEVar4;
    if (ppEVar4 != (ENetPeer **)0x0) {
      if (peerCount != 0) {
        sVar6 = 0;
        do {
          pEVar5 = (ENetPeer *)enet_malloc(0x1d8);
          __s->peer_list[sVar6] = pEVar5;
          memset(__s->peer_list[sVar6],0,0x1d8);
          sVar6 = sVar6 + 1;
        } while (peerCount != sVar6);
      }
      socket = enet_socket_create(ENET_SOCKET_TYPE_DATAGRAM);
      __s->socket = socket;
      if (socket != -1) {
        if (address == (ENetAddress *)0x0) {
          enet_socket_set_option(socket,ENET_SOCKOPT_NONBLOCK,1);
          enet_socket_set_option(__s->socket,ENET_SOCKOPT_BROADCAST,1);
          enet_socket_set_option(__s->socket,ENET_SOCKOPT_RCVBUF,0x40000);
          enet_socket_set_option(__s->socket,ENET_SOCKOPT_SNDBUF,0x40000);
LAB_00103834:
          sVar6 = 0xff;
          if (0xffffffffffffff00 < channelLimit - 0x100) {
            sVar6 = channelLimit;
          }
          __s->randomSeed = (enet_uint32)__s;
          eVar2 = enet_host_random_seed();
          uVar3 = eVar2 + __s->randomSeed;
          __s->randomSeed = uVar3 * 0x10000 | uVar3 >> 0x10;
          __s->channelLimit = sVar6;
          __s->incomingBandwidth = incomingBandwidth;
          __s->outgoingBandwidth = outgoingBandwidth;
          __s->bandwidthThrottleEpoch = 0;
          __s->mtu = 0x578;
          __s->recalculateBandwidthLimits = 0;
          __s->peerCount = peerCount;
          __s->commandCount = 0;
          (__s->receivedAddress).host = 0;
          (__s->receivedAddress).port = 0;
          __s->bufferCount = 0;
          __s->checksum = (ENetChecksumCallback)0x0;
          __s->receivedData = (enet_uint8 *)0x0;
          __s->receivedDataLength = 0;
          __s->totalSentData = 0;
          __s->totalSentPackets = 0;
          __s->totalReceivedData = 0;
          __s->totalReceivedPackets = 0;
          __s->connectedPeers = 0;
          __s->bandwidthLimitedPeers = 0;
          __s->duplicatePeers = 0xffffff;
          __s->maximumPacketSize = 0x2000000;
          __s->maximumWaitingData = 0x2000000;
          __s->intercept = (ENetInterceptCallback)0x0;
          (__s->compressor).context = (void *)0x0;
          (__s->compressor).compress =
               (_func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *)0x0;
          (__s->compressor).decompress =
               (_func_size_t_void_ptr_enet_uint8_ptr_size_t_enet_uint8_ptr_size_t *)0x0;
          (__s->compressor).destroy = (_func_void_void_ptr *)0x0;
          enet_list_clear(&__s->dispatchQueue);
          if (__s->peerCount == 0) {
            return __s;
          }
          uVar7 = 0;
          do {
            pEVar5 = __s->peer_list[uVar7];
            pEVar5->host = __s;
            pEVar5->incomingPeerID = (enet_uint32)uVar7;
            pEVar5->outgoingSessionID = 0xff;
            pEVar5->incomingSessionID = 0xff;
            pEVar5->data = (void *)0x0;
            enet_list_clear(&pEVar5->acknowledgements);
            enet_list_clear(&pEVar5->sentReliableCommands);
            enet_list_clear(&pEVar5->sentUnreliableCommands);
            enet_list_clear(&pEVar5->outgoingReliableCommands);
            enet_list_clear(&pEVar5->outgoingUnreliableCommands);
            enet_list_clear(&pEVar5->dispatchedCommands);
            enet_peer_reset(pEVar5);
            uVar7 = uVar7 + 1;
          } while (uVar7 < __s->peerCount);
          return __s;
        }
        iVar1 = enet_socket_bind(socket,address);
        if (-1 < iVar1) {
          enet_socket_set_option(__s->socket,ENET_SOCKOPT_NONBLOCK,1);
          enet_socket_set_option(__s->socket,ENET_SOCKOPT_BROADCAST,1);
          enet_socket_set_option(__s->socket,ENET_SOCKOPT_RCVBUF,0x40000);
          enet_socket_set_option(__s->socket,ENET_SOCKOPT_SNDBUF,0x40000);
          iVar1 = enet_socket_get_address(__s->socket,&__s->address);
          if (iVar1 < 0) {
            __s->address = *address;
          }
          goto LAB_00103834;
        }
      }
      if (__s->socket != -1) {
        enet_socket_destroy(__s->socket);
      }
      if (peerCount != 0) {
        sVar6 = 0;
        do {
          enet_free(__s->peer_list[sVar6]);
          sVar6 = sVar6 + 1;
        } while (peerCount != sVar6);
      }
      enet_free(__s->peer_list);
    }
    enet_free(__s);
  }
  return (ENetHost *)0x0;
}

Assistant:

ENetHost *
enet_host_create (const ENetAddress * address, size_t peerCount, size_t channelLimit, enet_uint32 incomingBandwidth, enet_uint32 outgoingBandwidth)
{
    ENetHost * host;
    ENetPeer * currentPeer;
    int i;

    if (peerCount > ENET_PROTOCOL_MAXIMUM_PEER_ID)
      return NULL;

    host = (ENetHost *) enet_malloc (sizeof (ENetHost));
    if (host == NULL)
      return NULL;
    memset (host, 0, sizeof (ENetHost));

    host -> peer_list = (ENetPeer **) enet_malloc (ENET_PROTOCOL_MAXIMUM_PEER_ID * sizeof (ENetPeer*));
    if (host -> peer_list == NULL)
    {
       enet_free (host);

       return NULL;
    }
    for (i=0; i < peerCount; i++) {
	host -> peer_list[i] = enet_malloc (sizeof (ENetPeer));
	memset (host -> peer_list[i], 0, sizeof (ENetPeer));
    }

    host -> socket = enet_socket_create (ENET_SOCKET_TYPE_DATAGRAM);
    if (host -> socket == ENET_SOCKET_NULL || (address != NULL && enet_socket_bind (host -> socket, address) < 0))
    {
       if (host -> socket != ENET_SOCKET_NULL)
         enet_socket_destroy (host -> socket);

       for (i=0; i < peerCount; i++) {
	   enet_free (host -> peer_list[i]);
       }
       enet_free (host -> peer_list);
       enet_free (host);

       return NULL;
    }

    enet_socket_set_option (host -> socket, ENET_SOCKOPT_NONBLOCK, 1);
    enet_socket_set_option (host -> socket, ENET_SOCKOPT_BROADCAST, 1);
    enet_socket_set_option (host -> socket, ENET_SOCKOPT_RCVBUF, ENET_HOST_RECEIVE_BUFFER_SIZE);
    enet_socket_set_option (host -> socket, ENET_SOCKOPT_SNDBUF, ENET_HOST_SEND_BUFFER_SIZE);

    if (address != NULL && enet_socket_get_address (host -> socket, & host -> address) < 0)   
      host -> address = * address;

    if (! channelLimit || channelLimit > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
      channelLimit = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;
    else
    if (channelLimit < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
      channelLimit = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;

    host -> randomSeed = (enet_uint32) (size_t) host;
    host -> randomSeed += enet_host_random_seed ();
    host -> randomSeed = (host -> randomSeed << 16) | (host -> randomSeed >> 16);
    host -> channelLimit = channelLimit;
    host -> incomingBandwidth = incomingBandwidth;
    host -> outgoingBandwidth = outgoingBandwidth;
    host -> bandwidthThrottleEpoch = 0;
    host -> recalculateBandwidthLimits = 0;
    host -> mtu = ENET_HOST_DEFAULT_MTU;
    host -> peerCount = peerCount;
    host -> commandCount = 0;
    host -> bufferCount = 0;
    host -> checksum = NULL;
    host -> receivedAddress.host = ENET_HOST_ANY;
    host -> receivedAddress.port = 0;
    host -> receivedData = NULL;
    host -> receivedDataLength = 0;
     
    host -> totalSentData = 0;
    host -> totalSentPackets = 0;
    host -> totalReceivedData = 0;
    host -> totalReceivedPackets = 0;

    host -> connectedPeers = 0;
    host -> bandwidthLimitedPeers = 0;
    host -> duplicatePeers = ENET_PROTOCOL_MAXIMUM_PEER_ID;
    host -> maximumPacketSize = ENET_HOST_DEFAULT_MAXIMUM_PACKET_SIZE;
    host -> maximumWaitingData = ENET_HOST_DEFAULT_MAXIMUM_WAITING_DATA;

    host -> compressor.context = NULL;
    host -> compressor.compress = NULL;
    host -> compressor.decompress = NULL;
    host -> compressor.destroy = NULL;

    host -> intercept = NULL;

    enet_list_clear (& host -> dispatchQueue);

    for (i = 0; i < host -> peerCount; i++ )
    {
       currentPeer = host -> peer_list[i];
       currentPeer -> host = host;
       currentPeer -> incomingPeerID = i;
       currentPeer -> outgoingSessionID = currentPeer -> incomingSessionID = 0xFF;
       currentPeer -> data = NULL;

       enet_list_clear (& currentPeer -> acknowledgements);
       enet_list_clear (& currentPeer -> sentReliableCommands);
       enet_list_clear (& currentPeer -> sentUnreliableCommands);
       enet_list_clear (& currentPeer -> outgoingReliableCommands);
       enet_list_clear (& currentPeer -> outgoingUnreliableCommands);
       enet_list_clear (& currentPeer -> dispatchedCommands);

       enet_peer_reset (currentPeer);
    }

    return host;
}